

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O0

void __thiscall
dlib::logger::global_data::set_output_stream(global_data *this,string *name,streambuf *buf)

{
  auto_mutex *in_RDI;
  auto_mutex M;
  string *in_stack_00000058;
  output_streambuf_container *in_stack_00000060;
  rmutex *in_stack_ffffffffffffffa8;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffa8);
  assign_tables<dlib::logger::global_data::output_streambuf_container,std::streambuf*>
            (in_stack_00000060,in_stack_00000058,
             (basic_streambuf<char,_std::char_traits<char>_> **)this);
  auto_mutex::~auto_mutex((auto_mutex *)0x3d8c28);
  return;
}

Assistant:

void logger::global_data::
    set_output_stream (
        const std::string& name,
        std::streambuf& buf 
    )
    {
        auto_mutex M(m);
        assign_tables( streambuf_table, name, &buf);
    }